

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O2

void ucnv_toUnicode_UTF8_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  UConverterSharedData *pUVar5;
  UBool UVar6;
  uint uVar7;
  UChar *pUVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  UChar *pUVar14;
  uint length;
  int iVar15;
  long lVar16;
  UChar UVar17;
  uint32_t prev;
  
  pUVar2 = args->converter;
  pbVar13 = (byte *)args->source;
  pUVar14 = args->target;
  piVar10 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  pUVar5 = pUVar2->sharedData;
  uVar11 = (uint)pUVar2->toULength;
  iVar15 = 0;
  pbVar12 = pbVar13;
  if (pUVar4 <= pUVar14 || (int)uVar11 < 1) goto LAB_002ab397;
  prev = pUVar2->toUnicodeStatus;
  length = pUVar2->mode;
  pUVar2->toULength = '\0';
  pUVar2->toUnicodeStatus = 0;
  iVar15 = 0;
  do {
    uVar9 = (ulong)uVar11;
    uVar7 = uVar11;
    if ((int)uVar11 <= (int)length) {
      uVar7 = length;
    }
    lVar16 = 0;
    while( true ) {
      pbVar12 = pbVar13 + lVar16;
      if ((long)(int)length <= (long)(uVar9 + lVar16)) break;
      if (pbVar3 <= pbVar12) {
        pUVar2->toUnicodeStatus = prev;
        pUVar2->mode = length;
        pUVar2->toULength = (char)uVar11 + (char)lVar16;
        goto LAB_002ab4f9;
      }
      bVar1 = *pbVar12;
      pUVar2->toUBytes[lVar16 + uVar9] = bVar1;
      UVar6 = icu_63::UTF8::isValidTrail(prev,bVar1,(int32_t)(uVar9 + lVar16),length);
      if ((UVar6 == '\0') &&
         ((((pUVar5 != &_CESU8Data_63 || (uVar9 + lVar16 != 1)) || (prev != 0xed)) ||
          (-0x41 < (char)bVar1)))) {
        uVar7 = uVar11 + (int)lVar16;
        break;
      }
      prev = prev * 0x40 + (uint)bVar1;
      lVar16 = lVar16 + 1;
    }
    if ((uVar7 != length) || (pUVar5 == &_CESU8Data_63 && 3 < uVar7)) {
      pUVar2->toULength = (int8_t)uVar7;
      *err = U_ILLEGAL_CHAR_FOUND;
LAB_002ab4f9:
      if ((pbVar12 < pbVar3) && ((pUVar4 <= pUVar14 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = pUVar14;
      args->source = (char *)pbVar12;
      args->offsets = piVar10;
      return;
    }
    uVar11 = prev - offsetsFromUTF8[(int)length];
    if (uVar11 < 0x10000) {
      *pUVar14 = (UChar)uVar11;
      pUVar8 = pUVar14 + 1;
      *piVar10 = iVar15;
      piVar10 = piVar10 + 1;
    }
    else {
      pUVar8 = pUVar14 + 1;
      *pUVar14 = (short)(uVar11 >> 10) + L'ퟀ';
      *piVar10 = iVar15;
      UVar17 = (UChar)uVar11 & 0x3ffU | 0xdc00;
      if (pUVar8 < pUVar4) {
        pUVar14[1] = UVar17;
        pUVar8 = pUVar14 + 2;
        piVar10[1] = iVar15;
        piVar10 = piVar10 + 2;
      }
      else {
        piVar10 = piVar10 + 1;
        pUVar2->UCharErrorBuffer[0] = UVar17;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
    }
    iVar15 = length + iVar15;
    pUVar14 = pUVar8;
LAB_002ab397:
    while( true ) {
      if ((pbVar3 <= pbVar12) || (pUVar4 <= pUVar14)) goto LAB_002ab4f9;
      bVar1 = *pbVar12;
      if ((char)bVar1 < '\0') break;
      *pUVar14 = (short)(char)bVar1;
      *piVar10 = iVar15;
      piVar10 = piVar10 + 1;
      iVar15 = iVar15 + 1;
      pbVar12 = pbVar12 + 1;
      pUVar14 = pUVar14 + 1;
    }
    prev = (uint32_t)bVar1;
    pUVar2->toUBytes[0] = bVar1;
    pbVar13 = pbVar12 + 1;
    length = 0;
    uVar11 = 1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      length = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
    }
  } while( true );
}

Assistant:

static void  U_CALLCONV ucnv_toUnicode_UTF8_OFFSETS_LOGIC (UConverterToUnicodeArgs * args,
                                                UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    int32_t offsetNum = 0;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
            *(myOffsets++) = offsetNum++;
        }
        else
        {
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch);
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t)i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    *(myOffsets++) = offsetNum;
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                        *(myOffsets++) = offsetNum;
                    }
                    else
                    {
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
                offsetNum += i;
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {   /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}